

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

Type __thiscall wasm::Type::reinterpret(Type *this)

{
  bool bVar1;
  BasicType BVar2;
  Type *this_00;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_28;
  Type *local_18;
  Type *this_local;
  
  local_18 = this;
  bVar1 = isTuple(this);
  if (!bVar1) {
    local_28 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)begin(this);
    this_00 = Iterator::operator*((Iterator *)&local_28);
    BVar2 = getBasic(this_00);
    switch(BVar2) {
    case i32:
      Type((Type *)&this_local,f32);
      break;
    case i64:
      Type((Type *)&this_local,f64);
      break;
    case f32:
      Type((Type *)&this_local,i32);
      break;
    case f64:
      Type((Type *)&this_local,i64);
      break;
    default:
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                         ,0x2c0);
    }
    return (Type)(uintptr_t)this_local;
  }
  __assert_fail("!isTuple() && \"Unexpected tuple type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x2b5,"Type wasm::Type::reinterpret() const");
}

Assistant:

Type Type::reinterpret() const {
  assert(!isTuple() && "Unexpected tuple type");
  switch ((*begin()).getBasic()) {
    case Type::i32:
      return f32;
    case Type::i64:
      return f64;
    case Type::f32:
      return i32;
    case Type::f64:
      return i64;
    default:
      WASM_UNREACHABLE("invalid type");
  }
}